

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_0::cleanup(anon_unknown_0 *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  istream *piVar2;
  long lVar3;
  ulong uVar4;
  size_type pos;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  undefined8 local_208 [2];
  undefined1 local_1f8 [8];
  undefined1 local_1f0 [8];
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  undefined8 local_1d8;
  string local_1d0 [8];
  string line;
  istringstream local_1a0 [8];
  istringstream s;
  string *str_local;
  string *res;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::istringstream::istringstream(local_1a0,ctx,8);
  std::__cxx11::string::string(local_1d0);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1a0,local_1d0);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    std::__cxx11::string::rbegin();
    std::__cxx11::string::rend();
    std::
    find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,skiwi::(anonymous_namespace)::cleanup(std::__cxx11::string)::__0>
              (&local_1e8,local_1f0,local_1f8);
    local_1e0._M_current =
         (char *)std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::base(&local_1e8);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_1d8,&local_1e0);
    local_210._M_current = (char *)std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)local_208,&local_210);
    std::__cxx11::string::erase(local_1d0,local_1d8,local_208[0]);
    lVar3 = std::__cxx11::string::find_first_not_of((char)local_1d0,0x20);
    if (lVar3 != -1) {
      std::__cxx11::string::append((string *)this);
      std::__cxx11::string::push_back((char)this);
    }
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::string::pop_back();
  }
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::istringstream::~istringstream(local_1a0);
  return;
}

Assistant:

std::string cleanup(std::string str)
    {
    std::string res;
    std::istringstream s(str);
    std::string line;
    while (std::getline(s, line))
      {
      line.erase(std::find_if(line.rbegin(), line.rend(), [](int ch)
        {
        return !std::isspace(ch);
        }).base(), line.end());
      auto pos = line.find_first_not_of(' ');
      if (pos != std::string::npos)
        {
        res.append(line);
        res.push_back('\n');
        }
      }
    if (!res.empty())
      res.pop_back(); // remove last newline char
    return res;
    }